

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O1

void ht_tcp_server_write(HT_TCPServer *server,char *buffer,size_t size)

{
  HT_Boolean HVar1;
  HT_TCPServer *server_00;
  size_t n;
  
  server_00 = (HT_TCPServer *)server->client_mutex;
  ht_mutex_lock((HT_Mutex *)server_00);
  if ((server->client_sock_fd).size != 0) {
    n = 0;
    do {
      HVar1 = ht_tcp_server_write_to_socket(server_00,(server->client_sock_fd).data[n],buffer,size);
      if (HVar1 == 0) {
        server_00 = (HT_TCPServer *)&server->client_sock_fd;
        ht_bag_int_remove_nth(&server->client_sock_fd,n);
        n = n - 1;
      }
      n = n + 1;
    } while (n < (server->client_sock_fd).size);
  }
  ht_mutex_unlock(server->client_mutex);
  return;
}

Assistant:

void
ht_tcp_server_write(HT_TCPServer* server, char* buffer, size_t size)
{
    size_t i;

    ht_mutex_lock(server->client_mutex);

    for (i = 0; i < ht_bag_size(server->client_sock_fd); i++)
    {
        if (!ht_tcp_server_write_to_socket(server, ht_bag_nth(server->client_sock_fd, i), buffer, size))
        {
            ht_bag_int_remove_nth(&server->client_sock_fd, i);
            i--;
        }
    }

    ht_mutex_unlock(server->client_mutex);
}